

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallDirectoryGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallDirectoryGenerator::GenerateScriptForConfig
          (cmInstallDirectoryGenerator *this,ostream *os,string *config,Indent *indent)

{
  Snapshot snapshot;
  char *pcVar1;
  pointer pbVar2;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  cmGeneratorExpression ge;
  allocator local_121;
  auto_ptr<cmCompiledGeneratorExpression> local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  ostream *local_100;
  Indent *local_f8;
  cmCommandContext local_f0;
  Snapshot local_c8;
  cmListFileBacktrace local_b0;
  cmGeneratorExpression local_70;
  
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100 = os;
  local_f8 = indent;
  cmState::Snapshot::Snapshot(&local_c8,(cmState *)0x0);
  local_f0.Name._M_dataplus._M_p = (pointer)&local_f0.Name.field_2;
  local_f0.Name._M_string_length = 0;
  local_f0.Name.field_2._M_local_buf[0] = '\0';
  local_f0.Line = 0;
  snapshot.Position.Tree = local_c8.Position.Tree;
  snapshot.State = local_c8.State;
  snapshot.Position.Position = local_c8.Position.Position;
  cmListFileBacktrace::cmListFileBacktrace(&local_b0,snapshot,&local_f0);
  cmGeneratorExpression::cmGeneratorExpression(&local_70,&local_b0);
  cmListFileBacktrace::~cmListFileBacktrace(&local_b0);
  std::__cxx11::string::~string((string *)&local_f0);
  for (pbVar2 = (this->Directories).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 != (this->Directories).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&local_b0,(string *)&local_70);
    local_120.x_ = (cmCompiledGeneratorExpression *)local_b0.Context.Name._M_dataplus._M_p;
    local_b0.Context.Name._M_dataplus._M_p = (pointer)0x0;
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&local_b0);
    local_f0.Name._M_dataplus._M_p = (pointer)&local_f0.Name.field_2;
    local_f0.Name._M_string_length = 0;
    local_f0.Name.field_2._M_local_buf[0] = '\0';
    pcVar1 = cmCompiledGeneratorExpression::Evaluate
                       (local_120.x_,this->LocalGenerator,config,false,(cmGeneratorTarget *)0x0,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                        &local_f0.Name);
    std::__cxx11::string::string((string *)&local_b0,pcVar1,&local_121);
    cmSystemTools::ExpandListArgument((string *)&local_b0,&local_118,false);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_f0);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_120);
  }
  AddDirectoryInstallRule(this,local_100,config,local_f8,&local_118);
  cmGeneratorExpression::~cmGeneratorExpression(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118);
  return;
}

Assistant:

void cmInstallDirectoryGenerator::GenerateScriptForConfig(
  std::ostream& os,
  const std::string& config,
  Indent const& indent)
{
  std::vector<std::string> dirs;
  cmGeneratorExpression ge;
  for(std::vector<std::string>::const_iterator i = this->Directories.begin();
      i != this->Directories.end(); ++i)
    {
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(*i);
    cmSystemTools::ExpandListArgument(cge->Evaluate(
        this->LocalGenerator, config), dirs);
    }
  this->AddDirectoryInstallRule(os, config, indent, dirs);
}